

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::operator*=(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,double s)

{
  store_t sVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  uchar v;
  long i;
  long k;
  int d;
  work_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this;
  long i_00;
  int iVar5;
  uint in_stack_ffffffffffffffd4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_28;
  long local_20;
  int local_14;
  
  local_14 = 0;
  while (iVar5 = local_14,
        iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDI),
        iVar5 < iVar3) {
    local_20 = 0;
    while (i_00 = local_20,
          lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI),
          i_00 < lVar4) {
      local_28 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0;
      while (this = local_28,
            lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI),
            (long)this < lVar4) {
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 & 0xffffff;
        sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                          (in_RDI,(long)local_28,local_20,local_14);
        in_stack_ffffffffffffffd4 = CONCAT13(sVar1,(int3)in_stack_ffffffffffffffd4);
        bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidS
                          (this,(store_t)((uint)in_stack_ffffffffffffffbc >> 0x18));
        if (bVar2) {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setLimited
                    ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,iVar5),i_00,(long)this,
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
        }
        local_28 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                   ((long)&local_28->depth + 1);
      }
      local_20 = local_20 + 1;
    }
    local_14 = local_14 + 1;
  }
  return in_RDI;
}

Assistant:

Image<T> &operator*=(Image<T> &image, double s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, static_cast<typename Image<T>::work_t>(v*s));
        }
      }
    }
  }

  return image;
}